

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cc
# Opt level: O0

void tvm::contrib::argsort<float,float>
               (DLTensor *input,DLTensor *output,int32_t axis,bool is_ascend)

{
  void *pvVar1;
  iterator iVar2;
  iterator iVar3;
  reference pvVar4;
  pair<long,_float> pVar5;
  size_type local_d0;
  int64_t k_1;
  pair<long,_float> local_88;
  long local_78;
  int64_t full_idx;
  int64_t k;
  int64_t base_idx;
  int local_58;
  int j;
  int i_1;
  int i;
  int axis_mul_after;
  int axis_mul_before;
  vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_> sorter;
  float *out_ptr;
  float *data_ptr;
  bool is_ascend_local;
  int32_t axis_local;
  DLTensor *output_local;
  DLTensor *input_local;
  
  pvVar1 = input->data;
  sorter.super__Vector_base<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)output->data;
  std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::vector
            ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_> *)
             &axis_mul_after);
  i = 1;
  i_1 = 1;
  for (j = 0; j < input->ndim; j = j + 1) {
    if (j < axis) {
      i = i * (int)input->shape[j];
    }
    else if (axis < j) {
      i_1 = i_1 * (int)input->shape[j];
    }
  }
  for (local_58 = 0; local_58 < i; local_58 = local_58 + 1) {
    for (base_idx._4_4_ = 0; base_idx._4_4_ < i_1; base_idx._4_4_ = base_idx._4_4_ + 1) {
      std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::clear
                ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_> *)
                 &axis_mul_after);
      k = (long)local_58 * input->shape[axis] * (long)i_1 + (long)base_idx._4_4_;
      for (full_idx = 0; full_idx < input->shape[axis]; full_idx = full_idx + 1) {
        local_78 = k + full_idx * i_1;
        pVar5 = std::make_pair<long&,float&>(&full_idx,(float *)((long)pvVar1 + local_78 * 4));
        local_88.first = pVar5.first;
        local_88.second = pVar5.second;
        std::vector<std::pair<long,float>,std::allocator<std::pair<long,float>>>::
        emplace_back<std::pair<long,float>>
                  ((vector<std::pair<long,float>,std::allocator<std::pair<long,float>>> *)
                   &axis_mul_after,&local_88);
      }
      if (is_ascend) {
        iVar2 = std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::begin
                          ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>
                            *)&axis_mul_after);
        iVar3 = std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::end
                          ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>
                            *)&axis_mul_after);
        std::
        stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,float>*,std::vector<std::pair<long,float>,std::allocator<std::pair<long,float>>>>,bool(*)(std::pair<long,float>const&,std::pair<long,float>const&)>
                  ((__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
                    )iVar2._M_current,
                   (__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
                    )iVar3._M_current,CompareAscend<float>);
      }
      else {
        iVar2 = std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::begin
                          ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>
                            *)&axis_mul_after);
        iVar3 = std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::end
                          ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>
                            *)&axis_mul_after);
        std::
        stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,float>*,std::vector<std::pair<long,float>,std::allocator<std::pair<long,float>>>>,bool(*)(std::pair<long,float>const&,std::pair<long,float>const&)>
                  ((__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
                    )iVar2._M_current,
                   (__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
                    )iVar3._M_current,CompareDescend<float>);
      }
      for (local_d0 = 0; (long)local_d0 < input->shape[axis]; local_d0 = local_d0 + 1) {
        pvVar4 = std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::
                 operator[]((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>
                             *)&axis_mul_after,local_d0);
        *(float *)((long)&(sorter.
                           super__Vector_base<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->first +
                  (k + local_d0 * (long)i_1) * 4) = (float)pvVar4->first;
      }
    }
  }
  std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>::~vector
            ((vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_> *)
             &axis_mul_after);
  return;
}

Assistant:

void argsort(DLTensor *input, DLTensor *output, int32_t axis, bool is_ascend) {
  auto data_ptr = static_cast<DataType *>(input->data);
  auto out_ptr = static_cast<OutType *>(output->data);
  std::vector<std::pair<int64_t, DataType>> sorter;

  int axis_mul_before = 1;
  int axis_mul_after = 1;
  for (int i = 0; i < input->ndim; ++i) {
    if (i < axis) {
      axis_mul_before *= input->shape[i];
    } else if (i > axis) {
      axis_mul_after *= input->shape[i];
    }
  }

  for (int i = 0; i < axis_mul_before; ++i) {
    for (int j = 0; j < axis_mul_after; ++j) {
      sorter.clear();
      int64_t base_idx = i * input->shape[axis] * axis_mul_after + j;
      for (int64_t k = 0; k < input->shape[axis]; ++k) {
        int64_t full_idx = base_idx + k * axis_mul_after;
        sorter.emplace_back(std::make_pair(k, data_ptr[full_idx]));
      }
      if (is_ascend) {
        std::stable_sort(sorter.begin(), sorter.end(), CompareAscend<DataType>);
      } else {
        std::stable_sort(sorter.begin(), sorter.end(), CompareDescend<DataType>);
      }
      for (int64_t k = 0; k < input->shape[axis]; ++k) {
        out_ptr[base_idx + k * axis_mul_after] = static_cast<OutType>(sorter[k].first);
      }
    }
  }
}